

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v6::
         format_to<fmt::v6::basic_string_view<char>,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,250ul,char>
                   (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf,
                   basic_string_view<char> *format_str,unsigned_long *args,unsigned_long *args_1,
                   unsigned_long *args_2)

{
  basic_string_view<char> format_str_00;
  iterator iVar1;
  size_t extraout_RDX;
  basic_string_view<char> *in_RSI;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDI;
  basic_string_view<char> s;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_unsigned_long,_unsigned_long,_unsigned_long>
  *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  buffer<char> *in_stack_ffffffffffffff98;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  in_stack_ffffffffffffffa0;
  v6 *this;
  char *pcVar2;
  
  internal::
  check_format_string<const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&,_fmt::v6::basic_string_view<char>,_0>
            (in_RSI);
  this = (v6 *)in_RSI->data_;
  pcVar2 = (char *)in_RSI->size_;
  s.size_ = extraout_RDX;
  s.data_ = pcVar2;
  to_string_view<char>(this,s);
  make_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>,unsigned_long,unsigned_long,unsigned_long>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,&in_RDI->types_);
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::basic_format_args<unsigned_long,unsigned_long,unsigned_long>(in_RDI,in_stack_ffffffffffffff58);
  format_str_00.size_ = (size_t)pcVar2;
  format_str_00.data_ = (char *)this;
  iVar1 = internal::vformat_to<char>
                    (in_stack_ffffffffffffff98,format_str_00,in_stack_ffffffffffffffa0);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::iterator format_to(
    basic_memory_buffer<Char, SIZE>& buf, const S& format_str, Args&&... args) {
  internal::check_format_string<Args...>(format_str);
  using context = buffer_context<Char>;
  return internal::vformat_to(buf, to_string_view(format_str),
                              {make_format_args<context>(args...)});
}